

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EGP.cpp
# Opt level: O2

ssize_t __thiscall Vault::Sys::Policies::EGP::read(EGP *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__buf_00;
  undefined4 in_register_00000034;
  Url UStack_38;
  
  __buf_00 = *(void **)CONCAT44(in_register_00000034,__fd);
  getUrl(&UStack_38,(EGP *)CONCAT44(in_register_00000034,__fd),(Path *)__buf);
  Policies::read((int)this,__buf_00,(size_t)&UStack_38);
  std::__cxx11::string::~string((string *)&UStack_38);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Policies::EGP::read(const Path &path) {
  return Vault::Sys::Policies::read(client_, getUrl(path));
}